

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  xml_node xVar1;
  char *pcVar2;
  xml_node cursor;
  string_t temp;
  allocator<char> local_59;
  xml_node local_58;
  string local_50 [32];
  
  local_58 = (xml_node)this->_root;
  pcVar2 = "";
  if (local_58._root != (xml_node_struct *)0x0) {
    pcVar2 = "";
    if ((local_58._root)->name != (char_t *)0x0) {
      pcVar2 = (local_58._root)->name;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)local_50);
  while( true ) {
    xVar1 = parent(&local_58);
    if (xVar1._root == (xml_node_struct *)0x0) break;
    local_58 = parent(&local_58);
    pcVar2 = "";
    if (local_58._root != (xml_node_struct *)0x0) {
      pcVar2 = "";
      if ((local_58._root)->name != (char_t *)0x0) {
        pcVar2 = (local_58._root)->name;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>(local_50,pcVar2,&local_59);
    std::__cxx11::string::push_back((char)local_50);
    std::__cxx11::string::append(local_50);
    std::__cxx11::string::swap((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		xml_node cursor = *this; // Make a copy.
		
		string_t result = cursor.name();

		while (cursor.parent())
		{
			cursor = cursor.parent();
			
			string_t temp = cursor.name();
			temp += delimiter;
			temp += result;
			result.swap(temp);
		}

		return result;
	}